

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_functions.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  ChStreamOutAscii *pCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar6;
  int i;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  shared_ptr<chrono::ChFunction_Repeat> f_rep_seq;
  shared_ptr<chrono::ChFunction_Sequence> f_seq;
  shared_ptr<chrono::ChFunction_Ramp> f_part3;
  shared_ptr<chrono::ChFunction_Const> f_part2;
  shared_ptr<chrono::ChFunction_Ramp> f_part1;
  shared_ptr<chrono::ChFunction_ConstAcc> f_constacc2;
  shared_ptr<chrono::ChFunction_Const> f_const;
  shared_ptr<chrono::ChFunction_ConstAcc> f_constacc1;
  ChFunction_MyTest f_test;
  string out_dir;
  ChFunction_Sequence f_sequence;
  undefined8 ****local_d28;
  undefined8 ****local_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  __shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> local_d08 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d00;
  __shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> local_cf8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cf0;
  __shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> local_ce8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ce0;
  __shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> local_cd8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cd0;
  __shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> local_cc8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cc0;
  __shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> local_cb8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cb0;
  string repeatfile;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_c88;
  string seqfile;
  string testfile;
  string sinefile;
  ChStreamOutAsciiFile file_f_sine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_be8 [29];
  ChStreamOutAscii local_920 [32];
  ChStreamOutAsciiFile file_f_repeat;
  ChStreamOutAscii local_630 [32];
  ChStreamOutAsciiFile file_f_sequence;
  ChStreamOutAscii local_340 [32];
  ChStreamOutAsciiFile file_f_test;
  ChStreamOutAscii local_50 [32];
  
  pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar5 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<
                     (pCVar5,"Copyright (c) 2017 projectchrono.org\nChrono version: ");
  pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,"7.0.0");
  chrono::ChStreamOutAscii::operator<<(pCVar5,"\n\n");
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          chrono::GetChronoOutputPath_abi_cxx11_();
  std::operator+(&out_dir,__lhs,"DEMO_FUNCTIONS");
  filesystem::path::path((path *)&file_f_sine,&out_dir);
  bVar4 = filesystem::create_directory((path *)&file_f_sine);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_be8);
  if (bVar4) {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar5,"==== Test 1...\n\n");
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar5,"   ChFunction_Ramp at x=0: y=");
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,1.4000000000000001);
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,"  dy/dx=");
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,0.1);
    chrono::ChStreamOutAscii::operator<<(pCVar5,"\n\n");
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar5,"==== Test 2...\n\n");
    std::operator+(&sinefile,&out_dir,"/f_sine_out.dat");
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
              (&file_f_sine,sinefile._M_dataplus._M_p,_S_trunc);
    for (iVar7 = 0; iVar7 != 100; iVar7 = iVar7 + 1) {
      dVar8 = (double)iVar7 / 50.0;
      dVar9 = (double)chrono::ChFunction_Sine::Get_y(dVar8);
      dVar10 = (double)chrono::ChFunction_Sine::Get_y_dx(dVar8);
      dVar11 = (double)chrono::ChFunction_Sine::Get_y_dxdx(dVar8);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_920,dVar8);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," ");
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,dVar9);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," ");
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,dVar10);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," ");
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,dVar11);
      chrono::ChStreamOutAscii::operator<<(pCVar5,"\n");
    }
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar5,"==== Test 3...\n\n");
    f_test = (ChFunction_MyTest)&PTR__ChFunction_0010aab8;
    std::operator+(&testfile,&out_dir,"/f_test_out.dat");
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
              (&file_f_test,testfile._M_dataplus._M_p,_S_trunc);
    for (iVar7 = 0; iVar7 != 100; iVar7 = iVar7 + 1) {
      dVar8 = (double)iVar7 / 50.0;
      dVar9 = cos(dVar8);
      dVar10 = chrono::ChFunction::Get_y_dx(&f_test.super_ChFunction,dVar8);
      dVar11 = chrono::ChFunction::Get_y_dxdx(&f_test.super_ChFunction,dVar8);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_50,dVar8);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," ");
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,dVar9);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," ");
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,dVar10);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," ");
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,dVar11);
      chrono::ChStreamOutAscii::operator<<(pCVar5,"\n");
    }
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar5,"==== Test 4...\n\n");
    local_d28 = &local_d28;
    _f_sequence = std::__cxx11::string::string;
    local_d18 = 0;
    uStack_d10 = 0;
    local_d20 = local_d28;
    std::make_shared<chrono::ChFunction_ConstAcc>();
    *(undefined8 *)
     (f_constacc1.super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     + 0x20) = 0x3fe0000000000000;
    *(undefined8 *)
     (f_constacc1.super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     + 8) = 0x3fd3333333333333;
    std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChFunction_ConstAcc,void>
              (local_cb8,
               &f_constacc1.
                super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>);
    chrono::ChFunction_Sequence::InsertFunct
              (0x3fe0000000000000,0x3ff0000000000000,&f_sequence,local_cb8,0,0,0,0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_cb0);
    std::make_shared<chrono::ChFunction_Const>();
    std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChFunction_Const,void>
              (local_cc8,
               &f_const.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>);
    chrono::ChFunction_Sequence::InsertFunct
              (0x3fd999999999999a,0x3ff0000000000000,&f_sequence,local_cc8,1,0,0,0xffffffffffffffff)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_cc0);
    std::make_shared<chrono::ChFunction_ConstAcc>();
    *(undefined8 *)
     (f_constacc2.super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     + 0x20) = 0x3fe3333333333333;
    *(undefined8 *)
     (f_constacc2.super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     + 0x10) = 0x3fd3333333333333;
    dVar8 = *(double *)
             (f_constacc2.
              super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             0x18);
    if (0.3 <= dVar8) {
      dVar9 = 0.7;
    }
    else {
      *(double *)
       (f_constacc2.super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr + 0x10) = dVar8;
      dVar9 = 0.7;
      if (0.7 < dVar8) {
        dVar9 = dVar8;
      }
    }
    *(double *)
     (f_constacc2.super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     + 0x18) = dVar9;
    *(undefined8 *)
     (f_constacc2.super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     + 8) = 0xbfc999999999999a;
    std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChFunction_ConstAcc,void>
              (local_cd8,
               &f_constacc2.
                super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>);
    chrono::ChFunction_Sequence::InsertFunct
              (0x3fe3333333333333,0x3ff0000000000000,&f_sequence,local_cd8,1,0,0,0xffffffffffffffff)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_cd0);
    chrono::ChFunction_Sequence::Setup();
    std::operator+(&seqfile,&out_dir,"/f_sequence_out.dat");
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
              (&file_f_sequence,seqfile._M_dataplus._M_p,_S_trunc);
    for (iVar7 = 0; iVar7 != 100; iVar7 = iVar7 + 1) {
      dVar8 = (double)iVar7 / 50.0;
      dVar9 = (double)chrono::ChFunction_Sequence::Get_y(dVar8);
      dVar10 = (double)chrono::ChFunction_Sequence::Get_y_dx(dVar8);
      dVar11 = (double)chrono::ChFunction_Sequence::Get_y_dxdx(dVar8);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_340,dVar8);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," ");
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,dVar9);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," ");
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,dVar10);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," ");
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,dVar11);
      chrono::ChStreamOutAscii::operator<<(pCVar5,"\n");
    }
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    chrono::ChStreamOutAscii::operator<<(pCVar5,"==== Test 5...\n\n");
    std::make_shared<chrono::ChFunction_Ramp>();
    *(undefined8 *)
     (f_part1.super___shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10)
         = 0x3fe0000000000000;
    std::make_shared<chrono::ChFunction_Const>();
    *(undefined8 *)
     (f_part2.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8) =
         0x3ff0000000000000;
    std::make_shared<chrono::ChFunction_Ramp>();
    *(undefined8 *)
     (f_part3.super___shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10)
         = 0xbfe0000000000000;
    std::make_shared<chrono::ChFunction_Sequence>();
    peVar3 = f_seq.super___shared_ptr<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChFunction_Ramp,void>
              (local_ce8,
               &f_part1.super___shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2>);
    chrono::ChFunction_Sequence::InsertFunct
              (0x3ff0000000000000,0x3ff0000000000000,peVar3,local_ce8,1,0,0,0xffffffffffffffff);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ce0);
    peVar3 = f_seq.super___shared_ptr<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChFunction_Const,void>
              (local_cf8,
               &f_part2.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>);
    chrono::ChFunction_Sequence::InsertFunct
              (0x3ff0000000000000,0x3ff0000000000000,peVar3,local_cf8,1,0,0,0xffffffffffffffff);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_cf0);
    std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChFunction_Ramp,void>
              (local_d08,
               &f_part3.super___shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2>);
    chrono::ChFunction_Sequence::InsertFunct
              (0x3ff0000000000000,0x3ff0000000000000,
               f_seq.super___shared_ptr<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,local_d08,1,0,0,0xffffffffffffffff);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d00);
    std::make_shared<chrono::ChFunction_Repeat>();
    peVar2 = f_rep_seq.super___shared_ptr<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChFunction_Sequence,void>
              ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_c88,
               &f_seq.super___shared_ptr<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)(peVar2 + 0x20),
               &local_c88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c88._M_refcount);
    auVar1 = vmovhpd_avx(ZEXT816(0) << 0x40,0x4008000000000000);
    *(undefined1 (*) [16])
     (f_rep_seq.super___shared_ptr<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8
     ) = auVar1;
    *(undefined8 *)
     (f_rep_seq.super___shared_ptr<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
     0x18) = 0x4008000000000000;
    std::operator+(&repeatfile,&out_dir,"/f_repeat_out.dat");
    chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
              (&file_f_repeat,repeatfile._M_dataplus._M_p,_S_trunc);
    for (iVar7 = 0; iVar7 != 1000; iVar7 = iVar7 + 1) {
      dVar8 = (double)iVar7 / 50.0;
      dVar9 = (double)(**(code **)(*(long *)f_rep_seq.
                                            super___shared_ptr<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr + 0x20))();
      dVar10 = (double)(**(code **)(*(long *)f_rep_seq.
                                             super___shared_ptr<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + 0x28))(dVar8);
      dVar11 = (double)(**(code **)(*(long *)f_rep_seq.
                                             super___shared_ptr<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + 0x30))(dVar8);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_630,dVar8);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," ");
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,dVar9);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," ");
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,dVar10);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," ");
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,dVar11);
      chrono::ChStreamOutAscii::operator<<(pCVar5,"\n");
    }
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_f_repeat);
    std::__cxx11::string::~string((string *)&repeatfile);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&f_rep_seq.super___shared_ptr<chrono::ChFunction_Repeat,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&f_seq.super___shared_ptr<chrono::ChFunction_Sequence,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&f_part3.super___shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&f_part2.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&f_part1.super___shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_f_sequence);
    std::__cxx11::string::~string((string *)&seqfile);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&f_constacc2.
                super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&f_const.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&f_constacc1.
                super___shared_ptr<chrono::ChFunction_ConstAcc,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    chrono::ChFunction_Sequence::~ChFunction_Sequence(&f_sequence);
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_f_test);
    std::__cxx11::string::~string((string *)&testfile);
    chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_f_sine);
    std::__cxx11::string::~string((string *)&sinefile);
    iVar7 = 0;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"Error creating directory ");
    poVar6 = std::operator<<(poVar6,(string *)&out_dir);
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar7 = 1;
  }
  std::__cxx11::string::~string((string *)&out_dir);
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
    GetLog() << "Copyright (c) 2017 projectchrono.org\nChrono version: " << CHRONO_VERSION << "\n\n";

    // Create (if needed) output directory
    const std::string out_dir = GetChronoOutputPath() + "DEMO_FUNCTIONS";
    if (!filesystem::create_directory(filesystem::path(out_dir))) {
        std::cout << "Error creating directory " << out_dir << std::endl;
        return 1;
    }

    //
    // EXAMPLE 1: create a ramp ChFunction, set properties, evaluate it.
    //

    GetLog() << "==== Test 1...\n\n";

    ChFunction_Ramp f_ramp;

    f_ramp.Set_ang(0.1);  // set angular coefficient;
    f_ramp.Set_y0(0.4);   // set y value for x=0;

    // Evaluate y=f(x) function at a given x value, using Get_y() :
    double y_ramp = f_ramp.Get_y(10);
    // Evaluate derivative df(x)/dx at a given x value, using Get_y_dx() :
    double ydx_ramp = f_ramp.Get_y_dx(10);

    GetLog() << "   ChFunction_Ramp at x=0: y=" << y_ramp << "  dy/dx=" << ydx_ramp << "\n\n";

    //
    // EXAMPLE 2: save values of a sine ChFunction  into a file
    //

    GetLog() << "==== Test 2...\n\n";

    ChFunction_Sine f_sine;

    f_sine.Set_amp(2);     // set amplitude;
    f_sine.Set_freq(1.5);  // set frequency;

    std::string sinefile = out_dir + "/f_sine_out.dat";
    ChStreamOutAsciiFile file_f_sine(sinefile.c_str());

    // Evaluate y=f(x) function along 100 x points, and its derivatives,
    // and save to file (later it can be loaded, for example, in Matlab using the 'load()' command)
    for (int i = 0; i < 100; i++) {
        double x = (double)i / 50.0;
        double y = f_sine.Get_y(x);
        double ydx = f_sine.Get_y_dx(x);
        double ydxdx = f_sine.Get_y_dxdx(x);
        file_f_sine << x << " " << y << " " << ydx << " " << ydxdx << "\n";
    }

    //
    // EXAMPLE 3: use a custom function (see class at the beginning of this file)
    //

    GetLog() << "==== Test 3...\n\n";

    // The following class will be used as an example of how
    // how you can create custom functions based on the ChFunction interface.
    // There is at least one mandatory member function to implement:  Get_y().
    // [Note that the base class implements a default computation of derivatives
    // Get_ydx() and Get_ydxdx() by using a numerical differentiation, however
    // if you know the analytical expression of derivatives, you can override
    // the base Get_ydx() and Get_ydxdx() too, for higher precision.]

    class ChFunction_MyTest : public ChFunction {
      public:
        virtual ChFunction_MyTest* Clone() const override { return new ChFunction_MyTest(); }

        virtual double Get_y(double x) const override { return cos(x); }  // just for test: simple cosine
    };

    ChFunction_MyTest f_test;

    std::string testfile = out_dir + "/f_test_out.dat";
    ChStreamOutAsciiFile file_f_test(testfile.c_str());

    // Evaluate y=f(x) function along 100 x points, and its derivatives,
    // and save to file (later it can be loaded, for example, in Matlab using the 'load()' command)
    for (int i = 0; i < 100; i++) {
        double x = (double)i / 50.0;
        double y = f_test.Get_y(x);
        double ydx = f_test.Get_y_dx(x);
        double ydxdx = f_test.Get_y_dxdx(x);
        file_f_test << x << " " << y << " " << ydx << " " << ydxdx << "\n";
    }

    //
    // EXAMPLE 4: mount some functions in a sequence using ChFunction_Sequence
    //

    GetLog() << "==== Test 4...\n\n";

    ChFunction_Sequence f_sequence;

    auto f_constacc1 = chrono_types::make_shared<ChFunction_ConstAcc>();
    f_constacc1->Set_end(0.5);  // length of ramp
    f_constacc1->Set_h(0.3);    // height of ramp
    f_sequence.InsertFunct(f_constacc1, 0.5, 1, false, false, false, 0);

    auto f_const = chrono_types::make_shared<ChFunction_Const>();
    f_sequence.InsertFunct(f_const, 0.4, 1, true, false, false, -1);

    auto f_constacc2 = chrono_types::make_shared<ChFunction_ConstAcc>();
    f_constacc2->Set_end(0.6);  // length of ramp
    f_constacc2->Set_av(0.3);   // acceleration ends after 30% length
    f_constacc2->Set_aw(0.7);   // deceleration starts after 70% length
    f_constacc2->Set_h(-0.2);   // height of ramp
    f_sequence.InsertFunct(f_constacc2, 0.6, 1, true, false, false, -1);

    f_sequence.Setup();

    std::string seqfile = out_dir + "/f_sequence_out.dat";
    ChStreamOutAsciiFile file_f_sequence(seqfile.c_str());

    // Evaluate y=f(x) function along 100 x points, and its derivatives,
    // and save to file (later it can be loaded, for example, in Matlab using the 'load()' command)
    for (int i = 0; i < 100; i++) {
        double x = (double)i / 50.0;
        double y = f_sequence.Get_y(x);
        double ydx = f_sequence.Get_y_dx(x);
        double ydxdx = f_sequence.Get_y_dxdx(x);
        file_f_sequence << x << " " << y << " " << ydx << " " << ydxdx << "\n";
    }

    //
    // EXAMPLE 5: a repeating sequence
    //

    GetLog() << "==== Test 5...\n\n";

    auto f_part1 = chrono_types::make_shared<ChFunction_Ramp>();
    f_part1->Set_ang(.50);
    auto f_part2 = chrono_types::make_shared<ChFunction_Const>();
    f_part2->Set_yconst(1.0);
    auto f_part3 = chrono_types::make_shared<ChFunction_Ramp>();
    f_part3->Set_ang(-.50);

    auto f_seq = chrono_types::make_shared<ChFunction_Sequence>();
    f_seq->InsertFunct(f_part1, 1.0, 1, true);
    f_seq->InsertFunct(f_part2, 1.0, 1., true);
    f_seq->InsertFunct(f_part3, 1.0, 1., true);

    auto f_rep_seq = chrono_types::make_shared<ChFunction_Repeat>();
    f_rep_seq->Set_fa(f_seq);
    f_rep_seq->Set_window_length(3.0);
    f_rep_seq->Set_window_start(0.0);
    f_rep_seq->Set_window_phase(3.0);

    std::string repeatfile = out_dir + "/f_repeat_out.dat";
    ChStreamOutAsciiFile file_f_repeat(repeatfile.c_str());
    for (int i = 0; i < 1000; i++) {
        double x = (double)i / 50.0;
        double y = f_rep_seq->Get_y(x);
        double ydx = f_rep_seq->Get_y_dx(x);
        double ydxdx = f_rep_seq->Get_y_dxdx(x);
        file_f_repeat << x << " " << y << " " << ydx << " " << ydxdx << "\n";
    }

    return 0;
}